

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O1

p_range_n * __thiscall
dna_bwt_n<dna_string_n>::LF
          (p_range_n *__return_storage_ptr__,dna_bwt_n<dna_string_n> *this,range_t rn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  p_rank_n start;
  p_rank_n local_78;
  p_rank_n local_50;
  
  dna_string_n::parallel_rank(&local_78,&this->BWT,rn.first);
  uVar6 = local_78.A;
  uVar7 = local_78.C;
  uVar8 = local_78.G;
  uVar9 = local_78.N;
  uVar10 = local_78.T;
  if (rn.first < rn.second) {
    dna_string_n::parallel_rank(&local_50,&this->BWT,rn.second);
    uVar6 = local_50.A;
    uVar7 = local_50.C;
    uVar8 = local_50.G;
    uVar9 = local_50.N;
    uVar10 = local_50.T;
  }
  uVar1 = this->F_A;
  uVar2 = this->F_C;
  uVar3 = this->F_G;
  uVar4 = this->F_N;
  uVar5 = this->F_T;
  (__return_storage_ptr__->A).first = local_78.A + uVar1;
  (__return_storage_ptr__->A).second = uVar6 + uVar1;
  (__return_storage_ptr__->C).first = local_78.C + uVar2;
  (__return_storage_ptr__->C).second = uVar7 + uVar2;
  (__return_storage_ptr__->G).first = local_78.G + uVar3;
  (__return_storage_ptr__->G).second = uVar8 + uVar3;
  (__return_storage_ptr__->N).first = local_78.N + uVar4;
  (__return_storage_ptr__->N).second = uVar9 + uVar4;
  (__return_storage_ptr__->T).first = local_78.T + uVar5;
  (__return_storage_ptr__->T).second = uVar10 + uVar5;
  return __return_storage_ptr__;
}

Assistant:

p_range_n LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank_n start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G,N before end of interval (last position of interval included)
		p_rank_n end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank_n f = {F_A,F_C,F_G,F_N,F_T};
		p_rank_n l = f + start;
		p_rank_n r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.N);
		assert(r.N <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}